

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::push_back<int>
          (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this,int *val)

{
  json_storage_kind jVar1;
  array_storage *this_00;
  json_runtime_error<std::domain_error,_void> *this_01;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_RSI;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_RDI;
  string *in_stack_ffffffffffffff98;
  json_array<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::vector>
  *in_stack_ffffffffffffffa0;
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  int *in_stack_ffffffffffffffe8;
  
  jVar1 = storage_kind(in_RDI);
  if (jVar1 == json_reference) {
    basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
    cast<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::json_reference_storage>
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
               in_stack_ffffffffffffffa0);
    json_reference_storage::value((json_reference_storage *)0x351299);
    push_back<int>(in_RSI,in_stack_ffffffffffffffe8);
  }
  else {
    if (jVar1 != array) {
      this_01 = (json_runtime_error<std::domain_error,_void> *)__cxa_allocate_exception(0x18);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
      json_runtime_error<std::domain_error,_void>::json_runtime_error
                (this_01,in_stack_ffffffffffffff98);
      __cxa_throw(this_01,&json_runtime_error<std::domain_error,void>::typeinfo,
                  json_runtime_error<std::domain_error,_void>::~json_runtime_error);
    }
    this_00 = basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
              cast<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::array_storage>
                        ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                         in_stack_ffffffffffffffa0);
    array_storage::value(this_00);
    json_array<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::vector>
    ::push_back<int,std::allocator<char>>
              (in_stack_ffffffffffffffa0,(int *)in_stack_ffffffffffffff98);
  }
  return;
}

Assistant:

void push_back(T&& val)
        {
            switch (storage_kind())
            {
                case json_storage_kind::array:
                    cast<array_storage>().value().push_back(std::forward<T>(val));
                    break;
                case json_storage_kind::json_reference:
                    cast<json_reference_storage>().value().push_back(std::forward<T>(val));
                    break;
                default:
                    JSONCONS_THROW(json_runtime_error<std::domain_error>("Attempting to insert into a value that is not an array"));
            }
        }